

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O1

Am_Wrapper * value_from_cycle_command_proc(Am_Object *param_1)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  long *plVar3;
  Am_Wrapper *pAVar4;
  Am_String s;
  Am_Value v;
  Am_Value valv;
  Am_String local_30;
  Am_Value local_28;
  Am_Value local_18;
  
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(0xa698,0x169);
  Am_Value::operator=(&local_18,pAVar1);
  local_30.data = (Am_String_Data *)0x0;
  local_28.type = 0;
  local_28.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get(0xa698,0x150);
  Am_Value::operator=(&local_28,pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"New value for command ",0x16);
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,&cy_cmd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is ",4);
  poVar2 = (ostream *)operator<<(poVar2,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," label is ",10);
  plVar3 = (long *)operator<<(poVar2,&local_28);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::ostream::flush();
  if (local_28.type == 0x8008) {
    Am_String::operator=(&local_30,&local_28);
  }
  else {
    Am_String::operator=(&local_30,"NOT TEXT");
  }
  pAVar4 = Am_String::operator_cast_to_Am_Wrapper_(&local_30);
  Am_Value::~Am_Value(&local_28);
  Am_String::~Am_String(&local_30);
  Am_Value::~Am_Value(&local_18);
  return pAVar4;
}

Assistant:

Am_Define_No_Self_Formula(bool, on_left_form)
{
  Am_Value value;
  // get the value from the checkbox widget's value.
  value = checkboxes.Peek(Am_VALUE);
  return !find_in_list(value, ON_RIGHT);
}